

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O3

MOJOSHADER_irExpression *
build_ir_compare(Context_conflict *ctx,MOJOSHADER_irConditionType operation,
                MOJOSHADER_irExpression *left,MOJOSHADER_irExpression *right,
                MOJOSHADER_irExpression *tval,MOJOSHADER_irExpression *fval)

{
  int iVar1;
  int iVar2;
  MOJOSHADER_astDataTypeType MVar3;
  int iVar4;
  MOJOSHADER_irStatement *pMVar5;
  MOJOSHADER_irStatement *pMVar6;
  MOJOSHADER_irExpression *pMVar7;
  MOJOSHADER_irStatement *pMVar8;
  MOJOSHADER_irStatement *pMVar9;
  MOJOSHADER_irStatement *pMVar10;
  MOJOSHADER_irStatement *pMVar11;
  MOJOSHADER_irStatement *next;
  int iVar12;
  
  iVar1 = ctx->ir_label_count;
  iVar2 = ctx->ir_temp_count;
  ctx->ir_label_count = iVar1 + 3;
  ctx->ir_temp_count = iVar2 + 1;
  if (((tval != (MOJOSHADER_irExpression *)0x0) && (fval != (MOJOSHADER_irExpression *)0x0)) &&
     (MVar3 = (tval->info).type, MVar3 == (fval->info).type)) {
    iVar4 = (tval->info).elements;
    if (iVar4 == (fval->info).elements) {
      pMVar5 = (MOJOSHADER_irStatement *)(*ctx->malloc)(0x38,ctx->malloc_data);
      if (pMVar5 == (MOJOSHADER_irStatement *)0x0) {
        ctx->isfail = 1;
        ctx->out_of_memory = 1;
      }
      else {
        (pMVar5->ir).type = MOJOSHADER_IR_CJUMP;
        (pMVar5->ir).filename = ctx->sourcefile;
        (pMVar5->ir).line = ctx->sourceline;
        (pMVar5->cjump).cond = operation;
        (pMVar5->move).src = left;
        (pMVar5->cjump).right = right;
        (pMVar5->cjump).iftrue = iVar1;
        (pMVar5->cjump).iffalse = iVar1 + 1;
      }
      pMVar6 = (MOJOSHADER_irStatement *)(*ctx->malloc)(0x20,ctx->malloc_data);
      if (pMVar6 == (MOJOSHADER_irStatement *)0x0) {
        ctx->isfail = 1;
        ctx->out_of_memory = 1;
      }
      else {
        (pMVar6->ir).type = MOJOSHADER_IR_LABEL;
        (pMVar6->ir).filename = ctx->sourcefile;
        (pMVar6->ir).line = ctx->sourceline;
        (pMVar6->jump).label = iVar1;
      }
      pMVar7 = (MOJOSHADER_irExpression *)(*ctx->malloc)(0x28,ctx->malloc_data);
      if (pMVar7 == (MOJOSHADER_irExpression *)0x0) {
        iVar12 = 1;
        ctx->isfail = 1;
        ctx->out_of_memory = 1;
      }
      else {
        (pMVar7->ir).type = MOJOSHADER_IR_TEMP;
        (pMVar7->ir).filename = ctx->sourcefile;
        (pMVar7->ir).line = ctx->sourceline;
        (pMVar7->info).type = MVar3;
        (pMVar7->info).elements = iVar4;
        (pMVar7->temp).index = iVar2;
        iVar12 = iVar2;
      }
      pMVar8 = new_ir_move(ctx,pMVar7,tval,iVar12);
      pMVar9 = (MOJOSHADER_irStatement *)(*ctx->malloc)(0x20,ctx->malloc_data);
      if (pMVar9 == (MOJOSHADER_irStatement *)0x0) {
        ctx->isfail = 1;
        ctx->out_of_memory = 1;
      }
      else {
        (pMVar9->ir).type = MOJOSHADER_IR_JUMP;
        (pMVar9->ir).filename = ctx->sourcefile;
        (pMVar9->ir).line = ctx->sourceline;
        (pMVar9->jump).label = iVar1 + 2;
      }
      pMVar10 = (MOJOSHADER_irStatement *)(*ctx->malloc)(0x20,ctx->malloc_data);
      if (pMVar10 == (MOJOSHADER_irStatement *)0x0) {
        ctx->isfail = 1;
        ctx->out_of_memory = 1;
      }
      else {
        (pMVar10->ir).type = MOJOSHADER_IR_LABEL;
        (pMVar10->ir).filename = ctx->sourcefile;
        (pMVar10->ir).line = ctx->sourceline;
        (pMVar10->jump).label = iVar1 + 1;
      }
      pMVar7 = (MOJOSHADER_irExpression *)(*ctx->malloc)(0x28,ctx->malloc_data);
      if (pMVar7 == (MOJOSHADER_irExpression *)0x0) {
        iVar12 = 1;
        ctx->isfail = 1;
        ctx->out_of_memory = 1;
      }
      else {
        (pMVar7->ir).type = MOJOSHADER_IR_TEMP;
        (pMVar7->ir).filename = ctx->sourcefile;
        (pMVar7->ir).line = ctx->sourceline;
        (pMVar7->info).type = MVar3;
        (pMVar7->info).elements = iVar4;
        (pMVar7->temp).index = iVar2;
        iVar12 = iVar2;
      }
      pMVar11 = new_ir_move(ctx,pMVar7,fval,iVar12);
      next = (MOJOSHADER_irStatement *)(*ctx->malloc)(0x20,ctx->malloc_data);
      if (next == (MOJOSHADER_irStatement *)0x0) {
        ctx->isfail = 1;
        ctx->out_of_memory = 1;
      }
      else {
        (next->ir).type = MOJOSHADER_IR_LABEL;
        (next->ir).filename = ctx->sourcefile;
        (next->ir).line = ctx->sourceline;
        (next->jump).label = iVar1 + 2;
      }
      pMVar11 = new_ir_seq(ctx,pMVar11,next);
      pMVar10 = new_ir_seq(ctx,pMVar10,pMVar11);
      pMVar9 = new_ir_seq(ctx,pMVar9,pMVar10);
      pMVar8 = new_ir_seq(ctx,pMVar8,pMVar9);
      pMVar6 = new_ir_seq(ctx,pMVar6,pMVar8);
      pMVar5 = new_ir_seq(ctx,pMVar5,pMVar6);
      pMVar7 = (MOJOSHADER_irExpression *)(*ctx->malloc)(0x28,ctx->malloc_data);
      if (pMVar7 == (MOJOSHADER_irExpression *)0x0) {
        ctx->isfail = 1;
        ctx->out_of_memory = 1;
      }
      else {
        (pMVar7->ir).type = MOJOSHADER_IR_TEMP;
        (pMVar7->ir).filename = ctx->sourcefile;
        (pMVar7->ir).line = ctx->sourceline;
        (pMVar7->info).type = MVar3;
        (pMVar7->info).elements = iVar4;
        (pMVar7->temp).index = iVar2;
      }
      pMVar7 = new_ir_eseq(ctx,pMVar5,pMVar7);
      return pMVar7;
    }
    __assert_fail("tval && fval && (tval->info.elements == fval->info.elements)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                  ,0x12ea,
                  "MOJOSHADER_irExpression *build_ir_compare(Context *, const MOJOSHADER_irConditionType, MOJOSHADER_irExpression *, MOJOSHADER_irExpression *, MOJOSHADER_irExpression *, MOJOSHADER_irExpression *)"
                 );
  }
  __assert_fail("tval && fval && (tval->info.type == fval->info.type)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                ,0x12e9,
                "MOJOSHADER_irExpression *build_ir_compare(Context *, const MOJOSHADER_irConditionType, MOJOSHADER_irExpression *, MOJOSHADER_irExpression *, MOJOSHADER_irExpression *, MOJOSHADER_irExpression *)"
               );
}

Assistant:

static MOJOSHADER_irExpression *build_ir_compare(Context *ctx,
                                    const MOJOSHADER_irConditionType operation,
                                    MOJOSHADER_irExpression *left,
                                    MOJOSHADER_irExpression *right,
                                    MOJOSHADER_irExpression *tval,
                                    MOJOSHADER_irExpression *fval)
{
    /* The gist...
            cjump x < y, t, f  // '<' is whatever operation
        t:
            move tmp, tval
            jump join
        f:
            move tmp, fval
        join:
    */

    const int t = generate_ir_label(ctx);
    const int f = generate_ir_label(ctx);
    const int join = generate_ir_label(ctx);
    const int tmp = generate_ir_temp(ctx);

    assert(tval && fval && (tval->info.type == fval->info.type));
    assert(tval && fval && (tval->info.elements == fval->info.elements));

    const MOJOSHADER_astDataTypeType dt = tval->info.type;
    const int elements = tval->info.elements;

    return new_ir_eseq(ctx,
                new_ir_seq(ctx, new_ir_cjump(ctx, operation, left, right, t, f),
                new_ir_seq(ctx, new_ir_label(ctx, t),
                new_ir_seq(ctx, new_ir_move(ctx, new_ir_temp(ctx, tmp, dt, elements), tval, -1),
                new_ir_seq(ctx, new_ir_jump(ctx, join),
                new_ir_seq(ctx, new_ir_label(ctx, f),
                new_ir_seq(ctx, new_ir_move(ctx, new_ir_temp(ctx, tmp, dt, elements), fval, -1),
                                new_ir_label(ctx, join))))))),
                    new_ir_temp(ctx, tmp, dt, elements));
}